

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O3

Quaternion *
AML::integrateQuat(Quaternion *__return_storage_ptr__,Quaternion *quat,Quaternion *quatRates,
                  double dt)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (quatRates->field_0).data[1];
  dVar2 = (quat->field_0).data[1];
  (__return_storage_ptr__->field_0).data[0] =
       (quat->field_0).data[0] + (quatRates->field_0).data[0] * dt;
  (__return_storage_ptr__->field_0).data[1] = dVar2 + dVar1 * dt;
  dVar1 = (quatRates->field_0).data[3];
  dVar2 = (quat->field_0).data[3];
  (__return_storage_ptr__->field_0).data[2] =
       (quat->field_0).data[2] + (quatRates->field_0).data[2] * dt;
  (__return_storage_ptr__->field_0).data[3] = dVar2 + dVar1 * dt;
  normalise(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Quaternion integrateQuat(const Quaternion& quat, const Quaternion& quatRates, double dt)
    {
        Quaternion quatNew = quat + quatRates * dt; // First Order Euler Integration
        normalise(quatNew);                         // Normalisation
        return quatNew;
    }